

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O1

void duckdb::ReservoirQuantileScalarOperation::
     Finalize<duckdb::hugeint_t,duckdb::ReservoirQuantileState<duckdb::hugeint_t>>
               (ReservoirQuantileState<duckdb::hugeint_t> *state,hugeint_t *target,
               AggregateFinalizeData *finalize_data)

{
  AggregateInputData *this;
  hugeint_t *phVar1;
  ulong uVar2;
  int64_t iVar3;
  long lVar4;
  reference pvVar5;
  ulong uVar6;
  hugeint_t *phVar7;
  double dVar8;
  undefined1 auVar9 [16];
  
  if (state->pos != 0) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    phVar1 = state->v;
    lVar4 = state->pos - 1;
    auVar9._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar9._0_8_ = lVar4;
    auVar9._12_4_ = 0x45300000;
    pvVar5 = vector<double,_true>::operator[]((vector<double,_true> *)((this->bind_data).ptr + 1),0)
    ;
    dVar8 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) * *pvVar5;
    uVar6 = (ulong)dVar8;
    uVar6 = (long)(dVar8 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6;
    phVar7 = phVar1 + uVar6;
    uVar2 = state->pos;
    if ((uVar2 != 0) && (uVar2 != uVar6)) {
      lVar4 = 0x3f;
      if (uVar2 != 0) {
        for (; uVar2 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      ::std::__introselect<duckdb::hugeint_t*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (phVar1,phVar7,phVar1 + uVar2,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    }
    iVar3 = phVar7->upper;
    target->lower = phVar7->lower;
    target->upper = iVar3;
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}
		D_ASSERT(state.v);
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->template Cast<ReservoirQuantileBindData>();
		auto v_t = state.v;
		D_ASSERT(bind_data.quantiles.size() == 1);
		auto offset = (idx_t)((double)(state.pos - 1) * bind_data.quantiles[0]);
		std::nth_element(v_t, v_t + offset, v_t + state.pos);
		target = v_t[offset];
	}